

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::
utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_prune(utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
           *this,time_point now)

{
  long lVar1;
  long lVar2;
  _List_node_base *p_Var3;
  _List_iterator<unsigned_long> _Var4;
  __off64_t *in_R8;
  size_t in_R9;
  long lVar5;
  
  if (*(long *)(this + 0x30) == 0) {
    return;
  }
  if ((long)now.__d.__r <
      *(long *)(*(long *)(this + 0x38) + *(long *)(*(long *)(this + 0xa0) + 0x10) * 0x40)) {
    do_erase(this,*(size_t *)(*(long *)(this + 0x90) + 0x10));
    return;
  }
  lVar5 = *(long *)(*(long *)(this + 0xa0) + 0x10) * 0x40;
  lVar2 = *(long *)(this + 0x38);
  lVar1 = lVar2 + lVar5;
  _Var4 = std::prev<std::_List_iterator<unsigned_long>>(*(_List_node_base **)(this + 0xb8),1);
  p_Var3 = *(_List_node_base **)(lVar2 + 0x10 + lVar5);
  if (p_Var3 != _Var4._M_node) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x88),
               (int)*(undefined8 *)(this + 0xb8),(__off64_t *)(this + 0x88),(int)p_Var3,in_R8,in_R9,
               SUB84(now.__d.__r,0));
  }
  *(undefined8 *)(this + 0xb8) = *(undefined8 *)(*(long *)(this + 0xb8) + 8);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::erase
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa0),
             *(_List_node_base **)(lVar1 + 0x18));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)(this + 0x50),
          (const_iterator)
          ((_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)(lVar1 + 8))
          ->_M_cur);
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + -1;
  return;
}

Assistant:

auto do_prune(std::chrono::steady_clock::time_point now) -> void
    {
        if (m_used_size > 0)
        {
            size_t   ttl_idx = *m_ttl_list.begin();
            element& e       = m_elements[ttl_idx];

            if (now >= e.m_expire_time)
            {
                do_erase(ttl_idx);
            }
            else
            {
                size_t lru_idx = m_lru_list.back();
                do_erase(lru_idx);
            }
        }
    }